

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O2

void __thiscall Assimp::MDL::HalfLife::HL1MDLLoader::read_global_info(HL1MDLLoader *this)

{
  bool bVar1;
  Header_HL1 *pHVar2;
  aiNode *this_00;
  aiMetadata *this_01;
  allocator<char> local_51;
  string local_50;
  aiVector3t<float> local_30;
  aiNode *global_info_node;
  
  this_00 = (aiNode *)operator_new(0x478);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"<MDL_global_info>",(allocator<char> *)&local_30);
  aiNode::aiNode(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  global_info_node = this_00;
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
            (&this->rootnode_children_,&global_info_node);
  bVar1 = this->import_settings_->read_misc_global_info;
  this_01 = aiMetadata::Alloc((uint)bVar1 + (uint)bVar1 * 4 + 0xb);
  global_info_node->mMetaData = this_01;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Version",&local_51);
  local_30.x = 1.4013e-44;
  aiMetadata::Set<int>(this_01,0,&local_50,(int *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"NumBodyparts",(allocator<char> *)&local_30);
  aiMetadata::Set<int>(this_01,1,&local_50,&this->header_->numbodyparts);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"NumModels",(allocator<char> *)&local_30);
  aiMetadata::Set<int>(this_01,2,&local_50,&this->total_models_);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"NumBones",(allocator<char> *)&local_30);
  aiMetadata::Set<int>(this_01,3,&local_50,&this->header_->numbones);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"NumAttachments",&local_51)
  ;
  local_30.x = 0.0;
  if (this->import_settings_->read_attachments == true) {
    local_30.x = (float)this->header_->numattachments;
  }
  aiMetadata::Set<int>(this_01,4,&local_50,(int *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"NumSkinFamilies",(allocator<char> *)&local_30);
  aiMetadata::Set<int>(this_01,5,&local_50,&this->texture_header_->numskinfamilies);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"NumHitboxes",&local_51);
  local_30.x = 0.0;
  if (this->import_settings_->read_hitboxes == true) {
    local_30.x = (float)this->header_->numhitboxes;
  }
  aiMetadata::Set<int>(this_01,6,&local_50,(int *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"NumBoneControllers",&local_51);
  local_30.x = 0.0;
  if (this->import_settings_->read_bone_controllers == true) {
    local_30.x = (float)this->header_->numbonecontrollers;
  }
  aiMetadata::Set<int>(this_01,7,&local_50,(int *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"NumSequences",&local_51);
  local_30.x = 0.0;
  if (this->import_settings_->read_animations == true) {
    local_30.x = (float)this->header_->numseq;
  }
  aiMetadata::Set<int>(this_01,8,&local_50,(int *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"NumBlendControllers",&local_51);
  local_30.x = 0.0;
  if (this->import_settings_->read_blend_controllers != false) {
    local_30.x = (float)this->num_blend_controllers_;
  }
  aiMetadata::Set<int>(this_01,9,&local_50,(int *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"NumTransitionNodes",&local_51);
  local_30.x = 0.0;
  if (this->import_settings_->read_sequence_transitions == true) {
    local_30.x = (float)this->header_->numtransitions;
  }
  aiMetadata::Set<int>(this_01,10,&local_50,(int *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (this->import_settings_->read_misc_global_info == true) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"EyePosition",&local_51);
    pHVar2 = this->header_;
    local_30.z = pHVar2->eyeposition[2];
    local_30.x = pHVar2->eyeposition[0];
    local_30.y = pHVar2->eyeposition[1];
    aiMetadata::Set<aiVector3t<float>>(this_01,0xb,&local_50,&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"HullMin",&local_51);
    pHVar2 = this->header_;
    local_30.z = pHVar2->min[2];
    local_30.x = pHVar2->min[0];
    local_30.y = pHVar2->min[1];
    aiMetadata::Set<aiVector3t<float>>(this_01,0xc,&local_50,&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"HullMax",&local_51);
    pHVar2 = this->header_;
    local_30.z = pHVar2->max[2];
    local_30.x = pHVar2->max[0];
    local_30.y = pHVar2->max[1];
    aiMetadata::Set<aiVector3t<float>>(this_01,0xd,&local_50,&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"CollisionMin",&local_51)
    ;
    pHVar2 = this->header_;
    local_30.z = pHVar2->bbmin[2];
    local_30.x = pHVar2->bbmin[0];
    local_30.y = pHVar2->bbmin[1];
    aiMetadata::Set<aiVector3t<float>>(this_01,0xe,&local_50,&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"CollisionMax",&local_51)
    ;
    pHVar2 = this->header_;
    local_30.z = pHVar2->bbmax[2];
    local_30.x = pHVar2->bbmax[0];
    local_30.y = pHVar2->bbmax[1];
    aiMetadata::Set<aiVector3t<float>>(this_01,0xf,&local_50,&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void HL1MDLLoader::read_global_info() {
    aiNode *global_info_node = new aiNode(AI_MDL_HL1_NODE_GLOBAL_INFO);
    rootnode_children_.push_back(global_info_node);

    aiMetadata *md = global_info_node->mMetaData = aiMetadata::Alloc(import_settings_.read_misc_global_info ? 16 : 11);
    md->Set(0, "Version", AI_MDL_HL1_VERSION);
    md->Set(1, "NumBodyparts", header_->numbodyparts);
    md->Set(2, "NumModels", total_models_);
    md->Set(3, "NumBones", header_->numbones);
    md->Set(4, "NumAttachments", import_settings_.read_attachments ? header_->numattachments : 0);
    md->Set(5, "NumSkinFamilies", texture_header_->numskinfamilies);
    md->Set(6, "NumHitboxes", import_settings_.read_hitboxes ? header_->numhitboxes : 0);
    md->Set(7, "NumBoneControllers", import_settings_.read_bone_controllers ? header_->numbonecontrollers : 0);
    md->Set(8, "NumSequences", import_settings_.read_animations ? header_->numseq : 0);
    md->Set(9, "NumBlendControllers", import_settings_.read_blend_controllers ? num_blend_controllers_ : 0);
    md->Set(10, "NumTransitionNodes", import_settings_.read_sequence_transitions ? header_->numtransitions : 0);

    if (import_settings_.read_misc_global_info) {
        md->Set(11, "EyePosition", aiVector3D(header_->eyeposition[0], header_->eyeposition[1], header_->eyeposition[2]));
        md->Set(12, "HullMin", aiVector3D(header_->min[0], header_->min[1], header_->min[2]));
        md->Set(13, "HullMax", aiVector3D(header_->max[0], header_->max[1], header_->max[2]));
        md->Set(14, "CollisionMin", aiVector3D(header_->bbmin[0], header_->bbmin[1], header_->bbmin[2]));
        md->Set(15, "CollisionMax", aiVector3D(header_->bbmax[0], header_->bbmax[1], header_->bbmax[2]));
    }
}